

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *__s;
  long *plVar4;
  uint *in_RDI;
  long in_FS_OFFSET;
  LRUHandle **ptr;
  uint32_t hash;
  LRUHandle *next;
  LRUHandle *h;
  uint32_t i;
  uint32_t count;
  LRUHandle **new_list;
  uint32_t new_length;
  long local_30;
  uint local_28;
  uint local_24;
  uint local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_14 = 4; local_14 < in_RDI[1]; local_14 = local_14 << 1) {
  }
  uVar3 = SUB168(ZEXT416(local_14) * ZEXT816(8),0);
  if (SUB168(ZEXT416(local_14) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar3);
  memset(__s,0,(ulong)local_14 << 3);
  local_24 = 0;
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    local_30 = *(long *)(*(long *)(in_RDI + 2) + (ulong)local_28 * 8);
    while (local_30 != 0) {
      lVar2 = *(long *)(local_30 + 0x10);
      plVar4 = (long *)((long)__s + (ulong)(*(uint *)(local_30 + 0x40) & local_14 - 1) * 8);
      *(long *)(local_30 + 0x10) = *plVar4;
      *plVar4 = local_30;
      local_24 = local_24 + 1;
      local_30 = lVar2;
    }
  }
  if (in_RDI[1] == local_24) {
    if (*(void **)(in_RDI + 2) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 2));
    }
    *(void **)(in_RDI + 2) = __s;
    *in_RDI = local_14;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("elems_ == count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                ,0x8e,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }